

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3InsertDocsize(int *pRC,Fts3Table *p,u32 *aSz)

{
  bool bVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  void *zData;
  long lVar6;
  byte *pbVar7;
  ulong uVar8;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_30;
  
  if (*pRC == 0) {
    iVar5 = p->nColumn;
    iVar4 = sqlite3_initialize();
    if (iVar4 == 0) {
      zData = sqlite3Malloc((long)iVar5 * 10);
    }
    else {
      zData = (void *)0x0;
    }
    if (zData == (void *)0x0) {
      iVar5 = 7;
    }
    else {
      iVar5 = p->nColumn;
      if ((long)iVar5 < 1) {
        iVar4 = 0;
      }
      else {
        lVar6 = 0;
        iVar4 = 0;
        do {
          pbVar3 = (byte *)((long)iVar4 + (long)zData);
          uVar8 = (ulong)aSz[lVar6];
          do {
            pbVar7 = pbVar3;
            bVar2 = (byte)uVar8;
            *pbVar7 = bVar2 | 0x80;
            iVar4 = iVar4 + 1;
            bVar1 = 0x7f < uVar8;
            pbVar3 = pbVar7 + 1;
            uVar8 = uVar8 >> 7;
          } while (bVar1);
          *pbVar7 = bVar2;
          lVar6 = lVar6 + 1;
        } while (lVar6 != iVar5);
      }
      iVar5 = fts3SqlStmt(p,0x14,&local_30,(sqlite3_value **)0x0);
      if (iVar5 == 0) {
        sqlite3_bind_int64(local_30,1,p->iPrevDocid);
        bindText(local_30,2,zData,iVar4,sqlite3_free,'\0');
        sqlite3_step(local_30);
        iVar5 = sqlite3_reset(local_30);
      }
      else {
        sqlite3_free(zData);
      }
    }
    *pRC = iVar5;
    return;
  }
  return;
}

Assistant:

static void fts3InsertDocsize(
  int *pRC,                       /* Result code */
  Fts3Table *p,                   /* Table into which to insert */
  u32 *aSz                        /* Sizes of each column, in tokens */
){
  char *pBlob;             /* The BLOB encoding of the document size */
  int nBlob;               /* Number of bytes in the BLOB */
  sqlite3_stmt *pStmt;     /* Statement used to insert the encoding */
  int rc;                  /* Result code from subfunctions */

  if( *pRC ) return;
  pBlob = sqlite3_malloc64( 10*(sqlite3_int64)p->nColumn );
  if( pBlob==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  fts3EncodeIntArray(p->nColumn, aSz, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_DOCSIZE, &pStmt, 0);
  if( rc ){
    sqlite3_free(pBlob);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int64(pStmt, 1, p->iPrevDocid);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, sqlite3_free);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
}